

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_vprintf(mg_connection *nc,char *fmt,__va_list_tag *ap)

{
  int len_00;
  char **ppcStack_90;
  int len;
  char *buf;
  char mem [100];
  __va_list_tag *ap_local;
  char *fmt_local;
  mg_connection *nc_local;
  
  ppcStack_90 = &buf;
  unique0x10000072 = ap;
  len_00 = mg_avprintf((char **)&stack0xffffffffffffff70,100,fmt,ap);
  if (0 < len_00) {
    mg_send(nc,ppcStack_90,len_00);
  }
  if ((ppcStack_90 != &buf) && (ppcStack_90 != (char **)0x0)) {
    free(ppcStack_90);
  }
  return len_00;
}

Assistant:

int mg_vprintf(struct mg_connection *nc, const char *fmt, va_list ap) {
    char mem[MG_VPRINTF_BUFFER_SIZE], *buf = mem;
    int len;

    if ((len = mg_avprintf(&buf, sizeof(mem), fmt, ap)) > 0) {
        mg_send(nc, buf, len);
    }
    if (buf != mem && buf != NULL) {
        MG_FREE(buf); /* LCOV_EXCL_LINE */
    }               /* LCOV_EXCL_LINE */

    return len;
}